

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMultiPartOutputFile.cpp
# Opt level: O0

void __thiscall Imf_3_3::MultiPartOutputFile::~MultiPartOutputFile(MultiPartOutputFile *this)

{
  bool bVar1;
  iterator this_00;
  pointer ppVar2;
  _Rb_tree_iterator<std::pair<const_int,_Imf_3_3::GenericOutputFile_*>_> *in_RDI;
  iterator it;
  map<int,_Imf_3_3::GenericOutputFile_*,_std::less<int>,_std::allocator<std::pair<const_int,_Imf_3_3::GenericOutputFile_*>_>_>
  *in_stack_ffffffffffffffc8;
  _Base_ptr p_Var3;
  GenericOutputFile *pGVar4;
  _Self local_18;
  
  in_RDI->_M_node = (_Base_ptr)&PTR__MultiPartOutputFile_004e7d40;
  this_00 = std::
            map<int,_Imf_3_3::GenericOutputFile_*,_std::less<int>,_std::allocator<std::pair<const_int,_Imf_3_3::GenericOutputFile_*>_>_>
            ::begin(in_stack_ffffffffffffffc8);
  while( true ) {
    local_18._M_node =
         (_Base_ptr)
         std::
         map<int,_Imf_3_3::GenericOutputFile_*,_std::less<int>,_std::allocator<std::pair<const_int,_Imf_3_3::GenericOutputFile_*>_>_>
         ::end(in_stack_ffffffffffffffc8);
    bVar1 = std::operator!=((_Self *)&stack0xfffffffffffffff0,&local_18);
    if (!bVar1) break;
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_int,_Imf_3_3::GenericOutputFile_*>_>::operator->
                       ((_Rb_tree_iterator<std::pair<const_int,_Imf_3_3::GenericOutputFile_*>_> *)
                        0x142e89);
    pGVar4 = ppVar2->second;
    if (pGVar4 != (GenericOutputFile *)0x0) {
      (*pGVar4->_vptr_GenericOutputFile[1])();
    }
    std::_Rb_tree_iterator<std::pair<const_int,_Imf_3_3::GenericOutputFile_*>_>::operator++
              (in_RDI,(int)((ulong)pGVar4 >> 0x20));
  }
  p_Var3 = in_RDI[1]._M_node;
  if (p_Var3 != (_Base_ptr)0x0) {
    Data::~Data((Data *)this_00._M_node);
    operator_delete(p_Var3,0xa0);
  }
  GenericOutputFile::~GenericOutputFile((GenericOutputFile *)in_RDI);
  return;
}

Assistant:

MultiPartOutputFile::~MultiPartOutputFile ()
{
    for (map<int, GenericOutputFile*>::iterator it =
             _data->_outputFiles.begin ();
         it != _data->_outputFiles.end ();
         it++)
    {
        delete it->second;
    }

    delete _data;
}